

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O2

bool __thiscall
crnlib::qdxt5::pack(qdxt5 *this,dxt5_block *pDst_elements,uint elements_per_block,
                   qdxt5_params *params)

{
  task_pool *ptVar1;
  byte bVar2;
  uint uVar3;
  crn_thread_id_t cVar4;
  uint uVar5;
  uint i;
  ulong uVar6;
  uint uVar7;
  uint i_1;
  uint uVar8;
  long lVar9;
  vector<crnlib::vector<unsigned_int>_> *pvVar10;
  float __x;
  float fVar11;
  float fVar12;
  optimize_selectors_params optimize_selectors_task_params;
  
  cVar4 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar4;
  this->m_canceled = false;
  this->m_pDst_elements = pDst_elements;
  this->m_elements_per_block = elements_per_block;
  memcpy(&this->m_params,params,0x62d);
  this->m_prev_percentage_complete = -1;
  __x = (float)(this->m_params).m_quality_level / 255.0;
  fVar11 = powf(__x,2.1);
  fVar12 = powf(__x,1.65);
  uVar8 = this->m_max_selector_clusters;
  uVar5 = (uint)(long)((float)uVar8 * fVar12);
  if (uVar5 < uVar8) {
    uVar8 = uVar5;
  }
  uVar3 = 0x20;
  if (0x1f < uVar5) {
    uVar3 = uVar8;
  }
  if (__x < 1.0) {
    uVar8 = (this->m_endpoint_clusterizer).m_codebook.m_size;
    uVar5 = (uint)(long)(fVar11 * (float)uVar8);
    if (uVar5 < uVar8) {
      uVar8 = uVar5;
    }
    uVar7 = 0x10;
    if (0xf < uVar5) {
      uVar7 = uVar8;
    }
    clusterizer<crnlib::vec<2U,_float>_>::retrieve_clusters
              (&this->m_endpoint_clusterizer,uVar7,&this->m_endpoint_cluster_indices);
    pvVar10 = this->m_cached_selector_cluster_indices + params->m_quality_level;
    this->m_progress_start = 0;
  }
  else {
    pvVar10 = &this->m_endpoint_cluster_indices;
    lVar9 = 0;
    vector<crnlib::vector<unsigned_int>_>::resize(pvVar10,this->m_num_blocks,false);
    for (uVar6 = 0; uVar6 < this->m_num_blocks; uVar6 = uVar6 + 1) {
      vector<unsigned_int>::resize
                ((vector<unsigned_int> *)((long)&pvVar10->m_p->m_p + lVar9),1,false);
      **(undefined4 **)((long)&pvVar10->m_p->m_p + lVar9) = (int)uVar6;
      lVar9 = lVar9 + 0x10;
    }
    uVar8 = params->m_quality_level;
    this->m_progress_start = 0;
    pvVar10 = this->m_cached_selector_cluster_indices + uVar8;
    if (1.0 <= __x) {
      this->m_progress_range = 100;
      goto LAB_0013f2e3;
    }
  }
  if (pvVar10->m_size == 0) {
    uVar7 = 0x21;
  }
  else {
    uVar7 = 0x32;
  }
  if ((this->m_params).m_dxt_quality == cCRNDXTQualitySuperFast) {
    uVar7 = 10;
  }
  this->m_progress_range = uVar7;
LAB_0013f2e3:
  for (uVar8 = 0; ptVar1 = this->m_pTask_pool, uVar8 <= ptVar1->m_num_threads; uVar8 = uVar8 + 1) {
    task_pool::queue_object_task<crnlib::qdxt5,void(crnlib::qdxt5::*)(unsigned_long_long,void*)>
              (ptVar1,this,0x13e726,0,(void *)(ulong)uVar8);
  }
  task_pool::join(ptVar1);
  bVar2 = this->m_canceled;
  if (__x < 1.0 && (bool)bVar2 == false) {
    if ((pvVar10->m_size == 0) &&
       (create_selector_clusters(this,uVar3,pvVar10), this->m_canceled == true)) {
      vector<crnlib::vector<unsigned_int>_>::clear(pvVar10);
      return false;
    }
    uVar3 = this->m_progress_start + this->m_progress_range;
    this->m_progress_start = uVar3;
    this->m_progress_range = 100 - uVar3;
    for (uVar8 = 0; ptVar1 = this->m_pTask_pool, uVar8 <= ptVar1->m_num_threads; uVar8 = uVar8 + 1)
    {
      task_pool::queue_object_task<crnlib::qdxt5,void(crnlib::qdxt5::*)(unsigned_long_long,void*)>
                (ptVar1,this,0x13ea2c,0,(void *)(ulong)uVar8);
    }
    task_pool::join(ptVar1);
    bVar2 = this->m_canceled;
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool qdxt5::pack(dxt5_block* pDst_elements, uint elements_per_block, const qdxt5_params& params) {
  CRNLIB_ASSERT(m_num_blocks);

  m_main_thread_id = crn_get_current_thread_id();
  m_canceled = false;

  m_pDst_elements = pDst_elements;
  m_elements_per_block = elements_per_block;
  m_params = params;

  m_prev_percentage_complete = -1;

  CRNLIB_ASSERT(m_params.m_quality_level <= qdxt5_params::cMaxQuality);
  const float quality = m_params.m_quality_level / (float)qdxt5_params::cMaxQuality;
  const float endpoint_quality = powf(quality, 2.1f);
  const float selector_quality = powf(quality, 1.65f);

  const uint max_endpoint_clusters = math::clamp<uint>(static_cast<uint>(m_endpoint_clusterizer.get_codebook_size() * endpoint_quality), 16U, m_endpoint_clusterizer.get_codebook_size());
  const uint max_selector_clusters = math::clamp<uint>(static_cast<uint>(m_max_selector_clusters * selector_quality), 32U, m_max_selector_clusters);

#if QDXT5_DEBUGGING
  trace("max endpoint clusters: %u\n", max_endpoint_clusters);
  trace("max selector clusters: %u\n", max_selector_clusters);
#endif

  if (quality >= 1.0f) {
    m_endpoint_cluster_indices.resize(m_num_blocks);
    for (uint i = 0; i < m_num_blocks; i++) {
      m_endpoint_cluster_indices[i].resize(1);
      m_endpoint_cluster_indices[i][0] = i;
    }
  } else
    m_endpoint_clusterizer.retrieve_clusters(max_endpoint_clusters, m_endpoint_cluster_indices);

  uint max_blocks = 0;
  for (uint i = 0; i < m_endpoint_cluster_indices.size(); i++) {
    uint num = m_endpoint_cluster_indices[i].size();
    max_blocks = math::maximum(max_blocks, num);
  }

  crnlib::vector<crnlib::vector<uint> >& selector_cluster_indices = m_cached_selector_cluster_indices[params.m_quality_level];

  m_progress_start = 0;
  if (quality >= 1.0f)
    m_progress_range = 100;
  else if (selector_cluster_indices.empty())
    m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 33;
  else
    m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 50;

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, &qdxt5::pack_endpoints_task, i);
  m_pTask_pool->join();

  if (m_canceled)
    return false;

  if (quality >= 1.0f)
    return true;

  if (selector_cluster_indices.empty()) {
    create_selector_clusters(max_selector_clusters, selector_cluster_indices);

    if (m_canceled) {
      selector_cluster_indices.clear();

      return false;
    }
  }

  m_progress_start += m_progress_range;
  m_progress_range = 100 - m_progress_start;

  optimize_selectors_params optimize_selectors_task_params(selector_cluster_indices);

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, &qdxt5::optimize_selectors_task, i, &optimize_selectors_task_params);

  m_pTask_pool->join();

  return !m_canceled;
}